

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtspd.c
# Opt level: O2

void storerequest(char *reqbuf,size_t totalsize)

{
  uint uVar1;
  int iVar2;
  FILE *__s;
  uint *puVar3;
  char *pcVar4;
  size_t sVar5;
  size_t __n;
  
  if (totalsize != 0 && reqbuf != (char *)0x0) {
    while (__s = fopen64("log/server.input","ab"), __n = totalsize, __s == (FILE *)0x0) {
      puVar3 = (uint *)__errno_location();
      uVar1 = *puVar3;
      if (uVar1 != 4) {
        pcVar4 = strerror(uVar1);
        logmsg("Error opening file %s error: %d %s","log/server.input",(ulong)uVar1,pcVar4);
        logmsg("Failed to write request input to log/server.input");
        return;
      }
    }
    do {
      sVar5 = fwrite(reqbuf + (totalsize - __n),1,__n,__s);
      if (got_exit_signal != 0) goto LAB_00106d10;
      __n = __n - sVar5;
      if (__n == 0) {
        logmsg("Wrote request (%zu bytes) input to log/server.input",totalsize);
        goto LAB_00106d10;
      }
      puVar3 = (uint *)__errno_location();
      uVar1 = *puVar3;
    } while (uVar1 == 4);
    pcVar4 = strerror(uVar1);
    logmsg("Error writing file %s error: %d %s","log/server.input",(ulong)uVar1,pcVar4);
    logmsg("Wrote only (%zu bytes) of (%zu bytes) request input to %s",totalsize - __n,totalsize,
           "log/server.input");
LAB_00106d10:
    while (iVar2 = fclose(__s), iVar2 != 0) {
      puVar3 = (uint *)__errno_location();
      uVar1 = *puVar3;
      if (uVar1 != 4) {
        pcVar4 = strerror(uVar1);
        logmsg("Error closing file %s error: %d %s","log/server.input",(ulong)uVar1,pcVar4);
        return;
      }
    }
  }
  return;
}

Assistant:

static void storerequest(char *reqbuf, size_t totalsize)
{
  int res;
  int error = 0;
  size_t written;
  size_t writeleft;
  FILE *dump;

  if(reqbuf == NULL)
    return;
  if(totalsize == 0)
    return;

  do {
    dump = fopen(REQUEST_DUMP, "ab");
  } while((dump == NULL) && ((error = errno) == EINTR));
  if(dump == NULL) {
    logmsg("Error opening file %s error: %d %s",
           REQUEST_DUMP, error, strerror(error));
    logmsg("Failed to write request input to " REQUEST_DUMP);
    return;
  }

  writeleft = totalsize;
  do {
    written = fwrite(&reqbuf[totalsize-writeleft],
                     1, writeleft, dump);
    if(got_exit_signal)
      goto storerequest_cleanup;
    if(written > 0)
      writeleft -= written;
  } while((writeleft > 0) && ((error = errno) == EINTR));

  if(writeleft == 0)
    logmsg("Wrote request (%zu bytes) input to " REQUEST_DUMP, totalsize);
  else if(writeleft > 0) {
    logmsg("Error writing file %s error: %d %s",
           REQUEST_DUMP, error, strerror(error));
    logmsg("Wrote only (%zu bytes) of (%zu bytes) request input to %s",
           totalsize-writeleft, totalsize, REQUEST_DUMP);
  }

storerequest_cleanup:

  do {
    res = fclose(dump);
  } while(res && ((error = errno) == EINTR));
  if(res)
    logmsg("Error closing file %s error: %d %s",
           REQUEST_DUMP, error, strerror(error));
}